

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O2

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConsiderExplicifyingAlgebraic<mp::LinearFunctionalConstraint>
          (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,LinearFunctionalConstraint *con,int i)

{
  _Invoker_type *this_00;
  bool bVar1;
  ConInfo *pCVar2;
  
  this_00 = &this[-8].MarkVarIfLogical_._M_invoker;
  bVar1 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                    ((FlatModel<mp::DefaultFlatModelParams> *)this_00,
                     (con->super_FunctionalConstraint).result_var_);
  if (bVar1) {
    bVar1 = HasExpressionArgs(this,&(con->affine_expr_).super_LinTerms);
    if (!bVar1) {
      pCVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ::GetInitExpression((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                    *)this_00,(con->super_FunctionalConstraint).result_var_);
      ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::LinearFunctionalConstraint>
      ::ConvertConstraint((ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::LinearFunctionalConstraint>
                           *)&this[0x48].MarkVar_._M_invoker,pCVar2->index_);
      return true;
    }
    DoExplicify<mp::LinearFunctionalConstraint,_true>(this,con,i);
  }
  return false;
}

Assistant:

bool ConsiderExplicifyingAlgebraic(const AlgFuncCon& con, int i) {
    if (MPCD( IsProperVar(con.GetResultVar()) )) {
      using TargetCon = AlgebraicConstraint<
          std::decay_t<decltype(con.GetArguments().GetBody())>,
          AlgConRhs<0> >;  // @todo can be ,=, >=
      if (!MPCD( template ModelAPIOk< TargetCon >() )
          || HasExpressionArgs(con.GetArguments())) {
        DoExplicify(con, i);          // as other explicified expressions
        return false;
      }
      auto& ck = GET_CONSTRAINT_KEEPER(AlgFuncCon);
      const auto& ie = MPD( GetInitExpression(con.GetResultVar()) );
      ck.ConvertConstraint(ie.GetIndex());
      return true;
    }
    return false;
  }